

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  _Alloc_hider input_00;
  allocator local_d1;
  string content;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  if (context == StripAllGeneratorExpressions) {
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    iVar11 = 0;
LAB_00412ed1:
    lVar9 = std::__cxx11::string::find((char *)input,0x54612f);
    if (lVar9 != -1) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
      pcVar10 = (input->_M_dataplus)._M_p + lVar9 + 2;
      iVar11 = 1;
      do {
        cVar2 = *pcVar10;
        if (cVar2 == '$') {
          pcVar1 = pcVar10 + 1;
          if (*pcVar1 == '<') {
            pcVar10 = pcVar10 + 1;
          }
          iVar11 = iVar11 + (uint)(*pcVar1 == '<');
        }
        else if (cVar2 == '>') {
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            iVar11 = 0;
            goto LAB_00412ed1;
          }
        }
        else if (cVar2 == '\0') goto LAB_00412f65;
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
    if (iVar11 == 0) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
    }
    StripEmptyListElements(__return_storage_ptr__,&result);
    goto LAB_00413003;
  }
  if (InstallInterface < context) {
    __assert_fail("0 && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpression.cxx"
                  ,0x1b5,
                  "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                 );
  }
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  iVar11 = 0;
  do {
    uVar6 = std::__cxx11::string::find((char *)input,0x5462d0);
    uVar7 = std::__cxx11::string::find((char *)input,0x55f846);
    if ((uVar7 & uVar6) == 0xffffffffffffffff) {
      if (iVar11 == 0) {
        std::__cxx11::string::substr((ulong)&content,(ulong)input);
        std::__cxx11::string::append((string *)&result);
        std::__cxx11::string::~string((string *)&content);
      }
      StripEmptyListElements(__return_storage_ptr__,&result);
LAB_00413003:
      std::__cxx11::string::~string((string *)&result);
      return __return_storage_ptr__;
    }
    uVar12 = uVar7;
    if (uVar6 < uVar7) {
      uVar12 = uVar6;
    }
    if (uVar7 == 0xffffffffffffffff) {
      uVar12 = uVar6;
    }
    if (uVar6 == 0xffffffffffffffff) {
      uVar12 = uVar7;
    }
    std::__cxx11::string::substr((ulong)&content,(ulong)input);
    std::__cxx11::string::append((string *)&result);
    std::__cxx11::string::~string((string *)&content);
    pcVar4 = (input->_M_dataplus)._M_p;
    cVar2 = pcVar4[uVar12 + 2];
    pcVar10 = pcVar4 + uVar12 + (ulong)(cVar2 == 'I') * 2 + 0x12;
    iVar11 = 1;
LAB_00412c3b:
    cVar3 = *pcVar10;
    if (cVar3 == '$') {
      pcVar1 = pcVar10 + 1;
      if (*pcVar1 == '<') {
        pcVar10 = pcVar10 + 1;
      }
      iVar11 = iVar11 + (uint)(*pcVar1 == '<');
LAB_00412c6b:
      pcVar10 = pcVar10 + 1;
      goto LAB_00412c3b;
    }
    if (cVar3 != '>') {
      if (cVar3 == '\0') goto LAB_00412dbb;
      goto LAB_00412c6b;
    }
    iVar11 = iVar11 + -1;
    if (iVar11 != 0) goto LAB_00412c6b;
    if ((context == BuildInterface) && (cVar2 != 'I')) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
    }
    else {
      if ((context != InstallInterface) || (cVar2 != 'I')) goto LAB_00412da9;
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      if (resolveRelative) {
        std::__cxx11::string::string((string *)&local_78,"${_IMPORT_PREFIX}/",&local_d1);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        Split(&content,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_58);
        for (input_00._M_p = local_58._M_dataplus._M_p;
            input_00._M_p != (pointer)local_58._M_string_length;
            input_00._M_p = input_00._M_p + 0x20) {
          std::__cxx11::string::append((char *)&result);
          bVar5 = cmsys::SystemTools::FileIsFullPath((((string *)input_00._M_p)->_M_dataplus)._M_p);
          if ((!bVar5) && (sVar8 = Find((string *)input_00._M_p), sVar8 != 0)) {
            std::__cxx11::string::append((string *)&result);
          }
          std::__cxx11::string::append((string *)&result);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        std::__cxx11::string::append((string *)&result);
      }
    }
    std::__cxx11::string::~string((string *)&content);
LAB_00412da9:
    iVar11 = 0;
    if (*pcVar10 == '\0') {
LAB_00412dbb:
      pcVar10 = "$<BUILD_INTERFACE:";
      if (cVar2 == 'I') {
        pcVar10 = "$<INSTALL_INTERFACE:";
      }
      std::__cxx11::string::string((string *)&local_78,pcVar10,&local_d1);
      std::__cxx11::string::substr((ulong)&local_58,(ulong)input);
      std::operator+(&content,&local_78,&local_58);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  } while( true );
LAB_00412f65:
  std::__cxx11::string::substr((ulong)&local_78,(ulong)input);
  std::operator+(&content,"$<",&local_78);
  std::__cxx11::string::append((string *)&result);
  std::__cxx11::string::~string((string *)&content);
  std::__cxx11::string::~string((string *)&local_78);
  goto LAB_00412ed1;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string &input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions)
    {
    return stripAllGeneratorExpressions(input);
    }
  else if (context == BuildInterface || context == InstallInterface)
    {
    return stripExportInterface(input, context, resolveRelative);
    }

  assert(0 && "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}